

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_CFROUND(Instruction *this,ostream *os)

{
  byte bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *this_00;
  ostream *in_RSI;
  long in_RDI;
  int srcIndex;
  
  bVar1 = *(byte *)(in_RDI + 2);
  poVar3 = std::operator<<(in_RSI,"r");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1 % 8);
  poVar3 = std::operator<<(poVar3,", ");
  uVar2 = getImm32((Instruction *)0x1181d1);
  this_00 = (void *)std::ostream::operator<<(poVar3,uVar2 & 0x3f);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Instruction::h_CFROUND(std::ostream& os) const {
		auto srcIndex = src % RegistersCount;
		os << "r" << srcIndex << ", " << (getImm32() & 63) << std::endl;
	}